

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O0

int ffgcks(fitsfile *fptr,unsigned_long *datasum,unsigned_long *hdusum,int *status)

{
  int iVar1;
  long bytepos;
  fitsfile *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  LONGLONG dataend;
  LONGLONG datastart;
  LONGLONG headstart;
  long nrec;
  int *in_stack_00000b20;
  unsigned_long *in_stack_00000b28;
  long in_stack_00000b30;
  fitsfile *in_stack_00000b38;
  int *in_stack_ffffffffffffffb8;
  LONGLONG *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  LONGLONG *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_RCX->HDUposition < 1) {
    iVar1 = ffghadll(in_RCX,in_stack_ffffffffffffffd0,
                     (LONGLONG *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (iVar1 < 1) {
      bytepos = ((long)in_stack_ffffffffffffffb8 - (long)in_stack_ffffffffffffffc0) / 0xb40;
      *in_RSI = 0;
      if (0 < bytepos) {
        ffmbyt(in_RCX,bytepos,in_stack_ffffffffffffffcc,(int *)in_stack_ffffffffffffffc0);
        iVar1 = ffcsum(in_stack_00000b38,in_stack_00000b30,in_stack_00000b28,in_stack_00000b20);
        if (0 < iVar1) {
          return in_RCX->HDUposition;
        }
      }
      ffmbyt(in_RCX,bytepos,in_stack_ffffffffffffffcc,(int *)in_stack_ffffffffffffffc0);
      *in_RDX = *in_RSI;
      ffcsum(in_stack_00000b38,in_stack_00000b30,in_stack_00000b28,in_stack_00000b20);
      local_4 = in_RCX->HDUposition;
    }
    else {
      local_4 = in_RCX->HDUposition;
    }
  }
  else {
    local_4 = in_RCX->HDUposition;
  }
  return local_4;
}

Assistant:

int ffgcks(fitsfile *fptr,           /* I - FITS file pointer             */
           unsigned long *datasum,   /* O - data checksum                 */
           unsigned long *hdusum,    /* O - hdu checksum                  */
           int *status)              /* IO - error status                 */

    /* calculate the checksums of the data unit and the total HDU */
{
    long nrec;
    LONGLONG headstart, datastart, dataend;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* get size of the HDU */
    if (ffghadll(fptr, &headstart, &datastart, &dataend, status) > 0)
        return(*status);

    nrec = (long) ((dataend - datastart) / 2880);

    *datasum = 0;

    if (nrec > 0)
    {
        /* accumulate the 32-bit 1's complement checksum */
        ffmbyt(fptr, datastart, REPORT_EOF, status);
        if (ffcsum(fptr, nrec, datasum, status) > 0)
            return(*status);
    }

    /* move to the start of the header and calc. size of header */
    ffmbyt(fptr, headstart, REPORT_EOF, status);
    nrec = (long) ((datastart - headstart) / 2880);

    /* accumulate the header checksum into the previous data checksum */
    *hdusum = *datasum;
    ffcsum(fptr, nrec, hdusum, status);

    return(*status);
}